

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::AddRequiredTargetCxxFeature
          (cmMakefile *this,cmTarget *target,string *feature,string *error)

{
  cmake *pcVar1;
  char *pcVar2;
  char **ppcVar3;
  ostream *poVar4;
  string *psVar5;
  char **ppcVar6;
  bool bVar7;
  char **ppcVar8;
  bool needCxx20;
  bool needCxx17;
  bool needCxx14;
  bool needCxx11;
  bool needCxx98;
  string local_210;
  string *local_1f0;
  cmStrCmp local_1e8;
  cmStrCmp local_1c8;
  ostringstream e;
  
  needCxx98 = false;
  needCxx11 = false;
  needCxx14 = false;
  needCxx17 = false;
  needCxx20 = false;
  CheckNeededCxxLanguage(this,feature,&needCxx98,&needCxx11,&needCxx14,&needCxx17,&needCxx20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CXX_STANDARD",(allocator<char> *)&local_210);
  pcVar2 = cmTarget::GetProperty(target,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  local_1f0 = error;
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"CMAKE_CXX_STANDARD_DEFAULT",(allocator<char> *)&local_210);
    pcVar2 = GetDefinition(this,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    if ((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) goto LAB_002907c1;
    ppcVar3 = (char **)0x0;
LAB_002908cf:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"CUDA_STANDARD",(allocator<char> *)&local_210);
    pcVar2 = cmTarget::GetProperty(target,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    if (pcVar2 == (char *)0x0) {
      ppcVar6 = (char **)0x0;
    }
    else {
      cmStrCmp::cmStrCmp(&local_1e8,pcVar2);
      ppcVar6 = std::find_if<char_const*const*,cmStrCmp>
                          (CXX_STANDARDS,(char **)&cmMakefileTargetGenerator::vtable,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      if (ppcVar6 == (char **)&cmMakefileTargetGenerator::vtable) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar4 = std::operator<<((ostream *)&e,"The CUDA_STANDARD property on target \"");
        psVar5 = cmTarget::GetName_abi_cxx11_(target);
        poVar4 = std::operator<<(poVar4,(string *)psVar5);
        poVar4 = std::operator<<(poVar4,"\" contained an invalid value: \"");
        poVar4 = std::operator<<(poVar4,pcVar2);
        std::operator<<(poVar4,"\".");
        psVar5 = local_1f0;
        if (local_1f0 != (string *)0x0) {
          std::__cxx11::stringbuf::str();
          goto LAB_002909ce;
        }
        pcVar1 = this->GlobalGenerator->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmake::IssueMessage(pcVar1,FATAL_ERROR,&local_210,&this->Backtrace);
        goto LAB_00290aa6;
      }
    }
    if (needCxx20 == false) {
      if (needCxx17 == false) {
        if (needCxx14 == false) {
          if (needCxx11 == false) {
            if (needCxx98 != true) {
              return true;
            }
            ppcVar8 = CXX_STANDARDS;
          }
          else {
            ppcVar8 = CXX_STANDARDS + 1;
          }
        }
        else {
          ppcVar8 = CXX_STANDARDS + 2;
        }
      }
      else {
        ppcVar8 = CXX_STANDARDS + 3;
      }
    }
    else {
      ppcVar8 = CXX_STANDARDS + 4;
    }
    if (ppcVar3 < ppcVar8) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"CXX_STANDARD",(allocator<char> *)&local_210);
      cmTarget::SetProperty(target,(string *)&e,*ppcVar8);
      std::__cxx11::string::~string((string *)&e);
    }
    bVar7 = true;
    if (ppcVar6 < ppcVar8) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"CUDA_STANDARD",(allocator<char> *)&local_210);
      cmTarget::SetProperty(target,(string *)&e,*ppcVar8);
      std::__cxx11::string::~string((string *)&e);
    }
  }
  else {
LAB_002907c1:
    cmStrCmp::cmStrCmp(&local_1c8,pcVar2);
    ppcVar3 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_STANDARDS,(char **)&cmMakefileTargetGenerator::vtable,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    if (ppcVar3 != (char **)&cmMakefileTargetGenerator::vtable) goto LAB_002908cf;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar4 = std::operator<<((ostream *)&e,"The CXX_STANDARD property on target \"");
    psVar5 = cmTarget::GetName_abi_cxx11_(target);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    poVar4 = std::operator<<(poVar4,"\" contained an invalid value: \"");
    poVar4 = std::operator<<(poVar4,pcVar2);
    std::operator<<(poVar4,"\".");
    psVar5 = local_1f0;
    if (local_1f0 == (string *)0x0) {
      pcVar1 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar1,FATAL_ERROR,&local_210,&this->Backtrace);
    }
    else {
      std::__cxx11::stringbuf::str();
LAB_002909ce:
      std::__cxx11::string::operator=((string *)psVar5,(string *)&local_210);
    }
LAB_00290aa6:
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool cmMakefile::AddRequiredTargetCxxFeature(cmTarget* target,
                                             const std::string& feature,
                                             std::string* error) const
{
  bool needCxx98 = false;
  bool needCxx11 = false;
  bool needCxx14 = false;
  bool needCxx17 = false;
  bool needCxx20 = false;

  this->CheckNeededCxxLanguage(feature, needCxx98, needCxx11, needCxx14,
                               needCxx17, needCxx20);

  const char* existingCxxStandard = target->GetProperty("CXX_STANDARD");
  if (existingCxxStandard == nullptr) {
    const char* defaultCxxStandard =
      this->GetDefinition("CMAKE_CXX_STANDARD_DEFAULT");
    if (defaultCxxStandard && *defaultCxxStandard) {
      existingCxxStandard = defaultCxxStandard;
    }
  }
  const char* const* existingCxxLevel = nullptr;
  if (existingCxxStandard) {
    existingCxxLevel =
      std::find_if(cm::cbegin(CXX_STANDARDS), cm::cend(CXX_STANDARDS),
                   cmStrCmp(existingCxxStandard));
    if (existingCxxLevel == cm::cend(CXX_STANDARDS)) {
      std::ostringstream e;
      e << "The CXX_STANDARD property on target \"" << target->GetName()
        << "\" contained an invalid value: \"" << existingCxxStandard << "\".";
      if (error) {
        *error = e.str();
      } else {
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                               e.str(), this->Backtrace);
      }
      return false;
    }
  }

  const char* existingCudaStandard = target->GetProperty("CUDA_STANDARD");
  const char* const* existingCudaLevel = nullptr;
  if (existingCudaStandard) {
    existingCudaLevel =
      std::find_if(cm::cbegin(CXX_STANDARDS), cm::cend(CXX_STANDARDS),
                   cmStrCmp(existingCudaStandard));
    if (existingCudaLevel == cm::cend(CXX_STANDARDS)) {
      std::ostringstream e;
      e << "The CUDA_STANDARD property on target \"" << target->GetName()
        << "\" contained an invalid value: \"" << existingCudaStandard
        << "\".";
      if (error) {
        *error = e.str();
      } else {
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                               e.str(), this->Backtrace);
      }
      return false;
    }
  }

  /* clang-format off */
  const char* const* needCxxLevel =
    needCxx20 ? &CXX_STANDARDS[4]
    : needCxx17 ? &CXX_STANDARDS[3]
    : needCxx14 ? &CXX_STANDARDS[2]
    : needCxx11 ? &CXX_STANDARDS[1]
    : needCxx98 ? &CXX_STANDARDS[0]
    : nullptr;
  /* clang-format on */

  if (needCxxLevel) {
    // Ensure the C++ language level is high enough to support
    // the needed C++ features.
    if (!existingCxxLevel || existingCxxLevel < needCxxLevel) {
      target->SetProperty("CXX_STANDARD", *needCxxLevel);
    }

    // Ensure the CUDA language level is high enough to support
    // the needed C++ features.
    if (!existingCudaLevel || existingCudaLevel < needCxxLevel) {
      target->SetProperty("CUDA_STANDARD", *needCxxLevel);
    }
  }

  return true;
}